

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeAddOp4Dup8(Vdbe *p,int op,int p1,int p2,int p3,u8 *zP4,int p4type)

{
  int iVar1;
  undefined8 *puVar2;
  int in_EDX;
  Vdbe *in_RDI;
  Vdbe *in_R9;
  undefined4 in_stack_00000008;
  char *p4copy;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  sqlite3 *in_stack_ffffffffffffffd8;
  
  sqlite3VdbeDb(in_RDI);
  puVar2 = (undefined8 *)
           sqlite3DbMallocRawNN
                     (in_stack_ffffffffffffffd8,
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = in_R9->db;
  }
  iVar1 = sqlite3VdbeAddOp4(in_R9,(int)((ulong)puVar2 >> 0x20),(int)puVar2,in_stack_ffffffffffffffd4
                            ,in_stack_ffffffffffffffd0,
                            (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_00000008),in_EDX);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddOp4Dup8(
  Vdbe *p,            /* Add the opcode to this VM */
  int op,             /* The new opcode */
  int p1,             /* The P1 operand */
  int p2,             /* The P2 operand */
  int p3,             /* The P3 operand */
  const u8 *zP4,      /* The P4 operand */
  int p4type          /* P4 operand type */
){
  char *p4copy = sqlite3DbMallocRawNN(sqlite3VdbeDb(p), 8);
  if( p4copy ) memcpy(p4copy, zP4, 8);
  return sqlite3VdbeAddOp4(p, op, p1, p2, p3, p4copy, p4type);
}